

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kpagent.c
# Opt level: O2

kp_error_t kp_agent_store(kp_agent *agent,kp_unsafe *unsafe)

{
  kp_agent_safe *pkVar1;
  kp_agent_safe *pkVar2;
  int iVar3;
  void *pvVar4;
  undefined8 uVar5;
  ulong uVar6;
  kp_agent_safe *a;
  int *piVar7;
  kp_agent_safe *pkVar8;
  kp_agent_safe *pkVar9;
  long lVar10;
  storage *psVar11;
  undefined8 *puVar12;
  kp_agent_safe *pkVar13;
  
  pvVar4 = malloc(0x1010);
  if (pvVar4 != (void *)0x0) {
    uVar5 = sodium_malloc(0x1000);
    *(undefined8 *)((long)pvVar4 + 0x1000) = uVar5;
    uVar5 = sodium_malloc(0x1000);
    *(undefined8 *)((long)pvVar4 + 0x1008) = uVar5;
    uVar6 = strlcpy(pvVar4,unsafe->name,0x1000);
    if ((((uVar6 < 0x1000) &&
         (uVar6 = strlcpy(*(undefined8 *)((long)pvVar4 + 0x1000),unsafe->password,0x1000),
         uVar6 < 0x1000)) &&
        (uVar6 = strlcpy(*(undefined8 *)((long)pvVar4 + 0x1008),unsafe->metadata,0x1000),
        uVar6 < 0x1000)) && (a = (kp_agent_safe *)malloc(0x28), a != (kp_agent_safe *)0x0)) {
      *(void **)(a->name + 0x20) = pvVar4;
      psVar11 = &storage;
      pkVar8 = (kp_agent_safe *)0x0;
      lVar10 = 8;
      while (pkVar1 = *(kp_agent_safe **)((kp_agent_safe *)psVar11)->name,
            pkVar1 != (kp_agent_safe *)0x0) {
        iVar3 = store_cmp((kp_store *)a,(kp_store *)pkVar1);
        pkVar8 = pkVar1;
        lVar10 = 0;
        psVar11 = (storage *)pkVar1;
        if (-1 < iVar3) {
          if (iVar3 == 0) {
            kp_agent_safe_free(*(kp_agent **)(pkVar1->name + 0x20),pkVar1);
            *(void **)(pkVar1->name + 0x20) = pvVar4;
            return 0;
          }
          psVar11 = (storage *)(pkVar1->name + 8);
          lVar10 = 8;
        }
      }
      *(kp_agent_safe **)(a->name + 0x10) = pkVar8;
      a->name[0] = '\0';
      a->name[1] = '\0';
      a->name[2] = '\0';
      a->name[3] = '\0';
      a->name[4] = '\0';
      a->name[5] = '\0';
      a->name[6] = '\0';
      a->name[7] = '\0';
      a->name[8] = '\0';
      a->name[9] = '\0';
      a->name[10] = '\0';
      a->name[0xb] = '\0';
      a->name[0xc] = '\0';
      a->name[0xd] = '\0';
      a->name[0xe] = '\0';
      a->name[0xf] = '\0';
      a->name[0x18] = '\x01';
      a->name[0x19] = '\0';
      a->name[0x1a] = '\0';
      a->name[0x1b] = '\0';
      if (pkVar8 == (kp_agent_safe *)0x0) {
        psVar11 = &storage;
      }
      else {
        psVar11 = (storage *)(pkVar8->name + lVar10);
      }
      *psVar11 = (storage)a;
      do {
        if ((pkVar8 == (kp_agent_safe *)0x0) || (*(int *)(pkVar8->name + 0x18) != 1)) {
          ((storage.rbh_root)->tree).rbe_color = 0;
          return 0;
        }
        pkVar1 = *(kp_agent_safe **)(pkVar8->name + 0x10);
        pkVar13 = *(kp_agent_safe **)pkVar1->name;
        pkVar9 = a;
        if (pkVar8 == pkVar13) {
          lVar10 = *(long *)(pkVar1->name + 8);
          if ((lVar10 != 0) && (*(int *)(lVar10 + 0x18) == 1)) {
            *(undefined4 *)(lVar10 + 0x18) = 0;
            goto LAB_0010508e;
          }
          pkVar2 = *(kp_agent_safe **)(pkVar8->name + 8);
          if (pkVar2 == a) {
            lVar10 = *(long *)pkVar2->name;
            *(long *)(pkVar8->name + 8) = lVar10;
            if (lVar10 == 0) {
              *(kp_agent_safe **)(pkVar2->name + 0x10) = pkVar1;
              puVar12 = *(undefined8 **)(pkVar8->name + 0x10);
LAB_0010516a:
              psVar11 = (storage *)(puVar12 + (pkVar8 != (kp_agent_safe *)*puVar12));
            }
            else {
              *(kp_agent_safe **)(lVar10 + 0x10) = pkVar8;
              puVar12 = *(undefined8 **)(pkVar8->name + 0x10);
              *(undefined8 **)(pkVar2->name + 0x10) = puVar12;
              psVar11 = &storage;
              if (puVar12 != (undefined8 *)0x0) goto LAB_0010516a;
            }
            psVar11->rbh_root = (kp_store *)pkVar2;
            *(kp_agent_safe **)pkVar2->name = pkVar8;
            *(kp_agent_safe **)(pkVar8->name + 0x10) = pkVar2;
            pkVar13 = *(kp_agent_safe **)pkVar1->name;
            pkVar9 = pkVar8;
            pkVar8 = a;
          }
          pkVar8->name[0x18] = '\0';
          pkVar8->name[0x19] = '\0';
          pkVar8->name[0x1a] = '\0';
          pkVar8->name[0x1b] = '\0';
          pkVar1->name[0x18] = '\x01';
          pkVar1->name[0x19] = '\0';
          pkVar1->name[0x1a] = '\0';
          pkVar1->name[0x1b] = '\0';
          lVar10 = *(long *)(pkVar13->name + 8);
          *(long *)pkVar1->name = lVar10;
          if (lVar10 != 0) {
            *(kp_agent_safe **)(lVar10 + 0x10) = pkVar1;
          }
          puVar12 = *(undefined8 **)(pkVar1->name + 0x10);
          *(undefined8 **)(pkVar13->name + 0x10) = puVar12;
          psVar11 = &storage;
          if (puVar12 != (undefined8 *)0x0) {
            psVar11 = (storage *)(puVar12 + (pkVar1 != (kp_agent_safe *)*puVar12));
          }
          psVar11->rbh_root = (kp_store *)pkVar13;
          *(kp_agent_safe **)(pkVar13->name + 8) = pkVar1;
LAB_001051c8:
          *(kp_agent_safe **)(pkVar1->name + 0x10) = pkVar13;
        }
        else {
          if ((pkVar13 == (kp_agent_safe *)0x0) || (*(int *)(pkVar13->name + 0x18) != 1)) {
            pkVar13 = *(kp_agent_safe **)pkVar8->name;
            if (pkVar13 == a) {
              lVar10 = *(long *)(pkVar13->name + 8);
              *(long *)pkVar8->name = lVar10;
              if (lVar10 == 0) {
                *(kp_agent_safe **)(pkVar13->name + 0x10) = pkVar1;
                puVar12 = *(undefined8 **)(pkVar8->name + 0x10);
LAB_00105101:
                psVar11 = (storage *)(puVar12 + (pkVar8 != (kp_agent_safe *)*puVar12));
              }
              else {
                *(kp_agent_safe **)(lVar10 + 0x10) = pkVar8;
                puVar12 = *(undefined8 **)(pkVar8->name + 0x10);
                *(undefined8 **)(pkVar13->name + 0x10) = puVar12;
                psVar11 = &storage;
                if (puVar12 != (undefined8 *)0x0) goto LAB_00105101;
              }
              psVar11->rbh_root = (kp_store *)pkVar13;
              *(kp_agent_safe **)(pkVar13->name + 8) = pkVar8;
              *(kp_agent_safe **)(pkVar8->name + 0x10) = pkVar13;
              pkVar9 = pkVar8;
              pkVar8 = a;
            }
            pkVar8->name[0x18] = '\0';
            pkVar8->name[0x19] = '\0';
            pkVar8->name[0x1a] = '\0';
            pkVar8->name[0x1b] = '\0';
            pkVar1->name[0x18] = '\x01';
            pkVar1->name[0x19] = '\0';
            pkVar1->name[0x1a] = '\0';
            pkVar1->name[0x1b] = '\0';
            pkVar13 = *(kp_agent_safe **)(pkVar1->name + 8);
            lVar10 = *(long *)pkVar13->name;
            *(long *)(pkVar1->name + 8) = lVar10;
            if (lVar10 != 0) {
              *(kp_agent_safe **)(lVar10 + 0x10) = pkVar1;
            }
            puVar12 = *(undefined8 **)(pkVar1->name + 0x10);
            *(undefined8 **)(pkVar13->name + 0x10) = puVar12;
            psVar11 = &storage;
            if (puVar12 != (undefined8 *)0x0) {
              psVar11 = (storage *)(puVar12 + (pkVar1 != (kp_agent_safe *)*puVar12));
            }
            psVar11->rbh_root = (kp_store *)pkVar13;
            *(kp_agent_safe **)pkVar13->name = pkVar1;
            goto LAB_001051c8;
          }
          pkVar13->name[0x18] = '\0';
          pkVar13->name[0x19] = '\0';
          pkVar13->name[0x1a] = '\0';
          pkVar13->name[0x1b] = '\0';
LAB_0010508e:
          pkVar8->name[0x18] = '\0';
          pkVar8->name[0x19] = '\0';
          pkVar8->name[0x1a] = '\0';
          pkVar8->name[0x1b] = '\0';
          pkVar1->name[0x18] = '\x01';
          pkVar1->name[0x19] = '\0';
          pkVar1->name[0x1a] = '\0';
          pkVar1->name[0x1b] = '\0';
          pkVar9 = pkVar1;
        }
        pkVar8 = *(kp_agent_safe **)(pkVar9->name + 0x10);
        a = pkVar9;
      } while( true );
    }
  }
  piVar7 = __errno_location();
  *piVar7 = 0xc;
  return 5;
}

Assistant:

kp_error_t
kp_agent_store(struct kp_agent *agent, struct kp_unsafe *unsafe)
{
	kp_error_t ret;
	struct kp_store *store, *existing;
	struct kp_agent_safe *safe;

	if ((ret = kp_agent_safe_create(agent, &safe)) != KP_SUCCESS) {
		return ret;
	}

	if (strlcpy(safe->name, unsafe->name, PATH_MAX) >= PATH_MAX) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}
	if (strlcpy(safe->password, unsafe->password, KP_PASSWORD_MAX_LEN)
	    >= KP_PASSWORD_MAX_LEN) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}
	if (strlcpy(safe->metadata, unsafe->metadata, KP_METADATA_MAX_LEN)
	    >= KP_METADATA_MAX_LEN) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}

	if ((store = malloc(sizeof(struct kp_store))) == NULL) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}

	store->safe = safe;

	existing = RB_INSERT(storage, &storage, store);
	if (existing != NULL) {
		kp_agent_safe_free(agent, existing->safe);
		existing->safe = safe;
	}

	ret = KP_SUCCESS;

out:
	return ret;
}